

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O0

bool getBool(Object *object)

{
  char cVar1;
  int iVar2;
  runtime_error *prVar3;
  long local_78;
  long local_68;
  long local_58;
  Variable *objectVariable;
  ObjectInt *objectInt;
  ObjectBool *objectBool;
  ObjectType type;
  Object *object_local;
  
  if (object == (Object *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"ScriptUtils::getBool => object is null!");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (**object->_vptr_Object)();
  cVar1 = (char)iVar2;
  if (cVar1 == '\x01') {
    if (object == (Object *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = __dynamic_cast(object,&Object::typeinfo,&ObjectBool::typeinfo,0);
    }
    object_local._7_1_ = (bool)(*(byte *)(local_58 + 8) & 1);
  }
  else if (cVar1 == '\0') {
    if (object == (Object *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = __dynamic_cast(object,&Object::typeinfo,&ObjectInt::typeinfo,0);
    }
    object_local._7_1_ = *(int *)(local_68 + 8) == 1;
  }
  else {
    if (cVar1 != '\x02') {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"ScriptUtils::getBool => wrong type!");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (object == (Object *)0x0) {
      local_78 = 0;
    }
    else {
      local_78 = __dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
    }
    object_local._7_1_ = getBool(*(Object **)(local_78 + 8));
  }
  return object_local._7_1_;
}

Assistant:

bool getBool(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getBool => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_BOOL) {
		auto* objectBool = dynamic_cast<ObjectBool*>(object);
		return objectBool->value;
	} else if (type == OT_INT) {
		auto *objectInt = dynamic_cast<ObjectInt *>(object);
		return objectInt->value == 1;
	} else if (type == OT_VARIABLE) {
		auto *objectVariable = dynamic_cast<Variable *>(object);
		return getBool(objectVariable->value);
	} else {
		throw std::runtime_error("ScriptUtils::getBool => wrong type!");
	}
}